

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O2

void ConcurrentCheckpoint::CheckpointThread<false>(DuckDB *db,bool *read_correct)

{
  bool bVar1;
  char cVar2;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  allocator_type local_d1;
  long *local_d0;
  bool *local_c8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_c0;
  string local_a8 [64];
  Connection con;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_48;
  
  local_c8 = read_correct;
  duckdb::Connection::Connection(&con,db);
  while (((byte)finished._M_base._M_i & 1) == 0) {
    std::__cxx11::string::string(local_a8,"SELECT SUM(money) FROM accounts",(allocator *)&local_d1);
    duckdb::Connection::Query((string *)&local_d0);
    std::__cxx11::string::~string(local_a8);
    duckdb::Value::Value((Value *)local_a8,100);
    __l._M_len = 1;
    __l._M_array = (iterator)local_a8;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_c0,__l,&local_d1);
    bVar1 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)&local_d0,0,(vector<duckdb::Value,_true> *)&local_c0);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_c0);
    duckdb::Value::~Value((Value *)local_a8);
    if (!bVar1) {
      *local_c8 = false;
    }
    if (local_d0 != (long *)0x0) {
      (**(code **)(*local_d0 + 8))();
    }
    do {
      std::__cxx11::string::string(local_a8,"CHECKPOINT",(allocator *)&local_d1);
      duckdb::Connection::Query((string *)&local_d0);
      std::__cxx11::string::~string(local_a8);
      duckdb::
      unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
      ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                    *)&local_d0);
      cVar2 = duckdb::BaseQueryResult::HasError();
      if (local_d0 != (long *)0x0) {
        (**(code **)(*local_d0 + 8))();
      }
    } while (cVar2 != '\0');
    std::__cxx11::string::string(local_a8,"SELECT SUM(money) FROM accounts",(allocator *)&local_d1);
    duckdb::Connection::Query((string *)&local_d0);
    std::__cxx11::string::~string(local_a8);
    duckdb::Value::Value((Value *)local_a8,100);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_a8;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_48,__l_00,&local_d1);
    bVar1 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)&local_d0,0,(vector<duckdb::Value,_true> *)&local_48);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_48);
    duckdb::Value::~Value((Value *)local_a8);
    if (!bVar1) {
      *local_c8 = false;
    }
    if (local_d0 != (long *)0x0) {
      (**(code **)(*local_d0 + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void CheckpointThread(DuckDB *db, bool *read_correct) {
		Connection con(*db);
		while (!finished) {
			{
				// the total balance should remain constant regardless of updates and checkpoints
				auto result = con.Query("SELECT SUM(money) FROM accounts");
				if (!CHECK_COLUMN(result, 0,
				                  {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
					*read_correct = false;
				}
			}
			while (true) {
				auto result = con.Query(FORCE_CHECKPOINT ? "FORCE CHECKPOINT" : "CHECKPOINT");
				if (!result->HasError()) {
					break;
				}
			}
			{
				// the total balance should remain constant regardless of updates and checkpoints
				auto result = con.Query("SELECT SUM(money) FROM accounts");
				if (!CHECK_COLUMN(result, 0,
				                  {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
					*read_correct = false;
				}
			}
		}
	}